

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<float,int,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  double dVar5;
  bool bVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  long lVar15;
  int *piVar16;
  double __z;
  double dVar17;
  double __z_00;
  double __z_01;
  double dVar18;
  double dVar19;
  double local_a8;
  
  lVar8 = (long)Xc_indptr[col_num];
  lVar15 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] != Xc_indptr[col_num + 1]) {
    dVar17 = 0.0;
    if (st <= end) {
      sVar11 = st;
      do {
        dVar17 = dVar17 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[ix_arr[sVar11]];
        sVar11 = sVar11 + 1;
      } while (sVar11 <= end);
    }
    if (0.0 < dVar17) {
      puVar7 = ix_arr + st;
      puVar14 = ix_arr + end + 1;
      uVar9 = (long)puVar14 - (long)puVar7 >> 3;
      if (0 < (long)uVar9) {
        do {
          uVar10 = uVar9 >> 1;
          uVar12 = ~uVar10 + uVar9;
          uVar9 = uVar10;
          if (puVar7[uVar10] < (ulong)(long)Xc_ind[lVar8]) {
            puVar7 = puVar7 + uVar10 + 1;
            uVar9 = uVar12;
          }
        } while (0 < (long)uVar9);
      }
      iVar2 = Xc_ind[lVar15 + -1];
      if (missing_action == Fail) {
        __z_01 = 0.0;
        if (lVar15 != lVar8 && puVar7 != puVar14) {
          pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a8 = 0.0;
          while (uVar9 = *puVar7, uVar9 <= (ulong)(long)iVar2) {
            piVar1 = Xc_ind + lVar8;
            iVar3 = *piVar1;
            if (iVar3 == (int)uVar9) {
              dVar5 = pdVar4[uVar9];
              dVar18 = (double)Xc[lVar8];
              dVar19 = dVar18 * dVar18;
              __z = fma(dVar5,dVar18,__z);
              __z_00 = fma(dVar5,dVar19,__z_00);
              local_a8 = fma(dVar5,dVar18 * dVar19,local_a8);
              __z_01 = fma(dVar5,dVar19 * dVar19,__z_01);
              if ((puVar7 == ix_arr + end) || (lVar8 == lVar15 + -1)) break;
              piVar16 = piVar1 + 1;
              puVar7 = puVar7 + 1;
              uVar9 = (long)Xc_ind + (lVar15 * 4 - (long)piVar16) >> 2;
              if (0 < (long)uVar9) {
                do {
                  uVar10 = uVar9 >> 1;
                  uVar12 = ~uVar10 + uVar9;
                  uVar9 = uVar10;
                  if ((ulong)(long)piVar16[uVar10] < *puVar7) {
                    piVar16 = piVar16 + uVar10 + 1;
                    uVar9 = uVar12;
                  }
                } while (0 < (long)uVar9);
              }
LAB_00136d67:
              lVar8 = (long)piVar16 - (long)Xc_ind >> 2;
            }
            else {
              if (iVar3 <= (int)uVar9) {
                piVar16 = piVar1 + 1;
                uVar10 = (long)Xc_ind + (lVar15 * 4 - (long)(piVar1 + 1)) >> 2;
                while (0 < (long)uVar10) {
                  uVar12 = uVar10 >> 1;
                  uVar13 = ~uVar12 + uVar10;
                  uVar10 = uVar12;
                  if ((ulong)(long)piVar16[uVar12] < uVar9) {
                    piVar16 = piVar16 + uVar12 + 1;
                    uVar10 = uVar13;
                  }
                }
                goto LAB_00136d67;
              }
              puVar7 = puVar7 + 1;
              uVar9 = (long)puVar14 - (long)puVar7 >> 3;
              while (0 < (long)uVar9) {
                uVar10 = uVar9 >> 1;
                uVar12 = ~uVar10 + uVar9;
                uVar9 = uVar10;
                if (puVar7[uVar10] < (ulong)(long)iVar3) {
                  puVar7 = puVar7 + uVar10 + 1;
                  uVar9 = uVar12;
                }
              }
            }
            if ((puVar7 == puVar14) || (lVar8 == lVar15)) break;
          }
        }
        else {
          local_a8 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
      }
      else {
        if (lVar15 != lVar8 && puVar7 != puVar14) {
          pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a8 = 0.0;
          __z_01 = 0.0;
          while (uVar9 = *puVar7, uVar9 <= (ulong)(long)iVar2) {
            piVar1 = Xc_ind + lVar8;
            iVar3 = *piVar1;
            if (iVar3 == (int)uVar9) {
              dVar5 = pdVar4[uVar9];
              dVar18 = (double)Xc[lVar8];
              if ((NAN(Xc[lVar8])) || (ABS(dVar18) == INFINITY)) {
                dVar17 = dVar17 - dVar5;
              }
              else {
                dVar19 = dVar18 * dVar18;
                __z = fma(dVar5,dVar18,__z);
                __z_00 = fma(dVar5,dVar19,__z_00);
                local_a8 = fma(dVar5,dVar18 * dVar19,local_a8);
                __z_01 = fma(dVar5,dVar19 * dVar19,__z_01);
              }
              if ((puVar7 == ix_arr + end) || (lVar8 == lVar15 + -1)) break;
              piVar16 = piVar1 + 1;
              puVar7 = puVar7 + 1;
              uVar9 = (long)Xc_ind + (lVar15 * 4 - (long)piVar16) >> 2;
              if (0 < (long)uVar9) {
                do {
                  uVar10 = uVar9 >> 1;
                  uVar12 = ~uVar10 + uVar9;
                  uVar9 = uVar10;
                  if ((ulong)(long)piVar16[uVar10] < *puVar7) {
                    piVar16 = piVar16 + uVar10 + 1;
                    uVar9 = uVar12;
                  }
                } while (0 < (long)uVar9);
              }
LAB_00136b30:
              lVar8 = (long)piVar16 - (long)Xc_ind >> 2;
            }
            else {
              if (iVar3 <= (int)uVar9) {
                piVar16 = piVar1 + 1;
                uVar10 = (long)Xc_ind + (lVar15 * 4 - (long)(piVar1 + 1)) >> 2;
                while (0 < (long)uVar10) {
                  uVar12 = uVar10 >> 1;
                  uVar13 = ~uVar12 + uVar10;
                  uVar10 = uVar12;
                  if ((ulong)(long)piVar16[uVar12] < uVar9) {
                    piVar16 = piVar16 + uVar12 + 1;
                    uVar10 = uVar13;
                  }
                }
                goto LAB_00136b30;
              }
              puVar7 = puVar7 + 1;
              uVar9 = (long)puVar14 - (long)puVar7 >> 3;
              while (0 < (long)uVar9) {
                uVar10 = uVar9 >> 1;
                uVar12 = ~uVar10 + uVar9;
                uVar9 = uVar10;
                if (puVar7[uVar10] < (ulong)(long)iVar3) {
                  puVar7 = puVar7 + uVar10 + 1;
                  uVar9 = uVar12;
                }
              }
            }
            if ((puVar7 == puVar14) || (lVar8 == lVar15)) break;
          }
        }
        else {
          __z_01 = 0.0;
          local_a8 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
        if (dVar17 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar17) && ((__z_00 != 0.0 || (NAN(__z_00))))) {
        if ((__z_00 != __z * __z) || (NAN(__z_00) || NAN(__z * __z))) {
          dVar19 = __z / dVar17;
          dVar5 = dVar19 * dVar19;
          dVar18 = __z_00 / dVar17 - dVar5;
          if ((!NAN(dVar18)) &&
             ((2.220446049250313e-16 < dVar18 ||
              (bVar6 = check_more_than_two_unique_values<float,int>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar6))
             )) {
            if (dVar18 <= 0.0) {
              return 0.0;
            }
            dVar17 = (dVar5 * dVar19 * dVar19 * dVar17 +
                     __z * -4.0 * dVar5 * dVar19 +
                     __z_00 * 6.0 * dVar5 + local_a8 * -4.0 * dVar19 + __z_01) /
                     (dVar18 * dVar18 * dVar17);
            if ((long)ABS(dVar17) < 0x7ff0000000000000) {
              if (dVar17 <= 0.0) {
                return 0.0;
              }
              return dVar17;
            }
            return -INFINITY;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}